

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

QPainterPath __thiscall QPainterPath::simplified(QPainterPath *this)

{
  bool bVar1;
  QPainterPath *in_RSI;
  long in_FS_OFFSET;
  QPainterPath local_60;
  undefined1 local_58 [24];
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isEmpty(in_RSI);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_003990cd:
      __stack_chk_fail();
    }
    QPainterPath(this,in_RSI);
  }
  else {
    local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPainterPath(&local_60);
    QPathClipper::QPathClipper((QPathClipper *)local_58,in_RSI,&local_60);
    ~QPainterPath(&local_60);
    QPathClipper::clip((QPathClipper *)this,(Operation)(QPathClipper *)local_58);
    ~QPainterPath((QPainterPath *)(local_58 + 8));
    ~QPainterPath((QPainterPath *)local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_003990cd;
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)this;
}

Assistant:

QPainterPath QPainterPath::simplified() const
{
    if (isEmpty())
        return *this;
    QPathClipper clipper(*this, QPainterPath());
    return clipper.clip(QPathClipper::Simplify);
}